

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O1

bool __thiscall
kainjow::mustache::
parser<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>::
parse_set_delimiter_tag
          (parser<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
           *this,basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                 *contents,
          delimiter_set<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          *delimiter_set)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *s;
  bool bVar4;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> begin;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> contents_substr;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> end;
  long *local_90;
  long local_88;
  long local_80 [2];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_70;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  if ((contents->_M_string_length < 5) ||
     ((contents->_M_dataplus)._M_p[contents->_M_string_length - 1] != L'=')) {
    return false;
  }
  std::__cxx11::wstring::substr((ulong)&local_90,(ulong)contents);
  trim<std::__cxx11::wstring>(&local_70,(mustache *)&local_90,s);
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] * 4 + 4);
  }
  bVar4 = false;
  lVar3 = std::__cxx11::wstring::find((wchar_t)&local_70,0x20);
  if (lVar3 == -1) goto LAB_001e3f4c;
  lVar3 = std::__cxx11::wstring::find_first_not_of((wchar_t)&local_70,0x20);
  if (lVar3 == -1) {
    __assert_fail("nonspace != string_type::npos",
                  "/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp"
                  ,0x33c,
                  "bool kainjow::mustache::parser<std::basic_string<wchar_t>>::parse_set_delimiter_tag(const string_type &, delimiter_set<string_type> &) const [string_type = std::basic_string<wchar_t>]"
                 );
  }
  std::__cxx11::wstring::substr((ulong)&local_90,(ulong)&local_70);
  std::__cxx11::wstring::substr((ulong)&local_50,(ulong)&local_70);
  plVar1 = local_90;
  bVar4 = local_88 == 0;
  if (((!bVar4) && ((int)*local_90 != 0x3d)) && (iVar2 = isspace((int)*local_90), iVar2 == 0)) {
    lVar3 = 4;
    do {
      bVar4 = local_88 << 2 == lVar3;
      if ((bVar4) || (*(int *)((long)plVar1 + lVar3) == 0x3d)) break;
      iVar2 = isspace(*(int *)((long)plVar1 + lVar3));
      lVar3 = lVar3 + 4;
    } while (iVar2 == 0);
  }
  plVar1 = local_50;
  if (bVar4) {
    bVar4 = local_48 == 0;
    if (((!bVar4) && ((int)*local_50 != 0x3d)) && (iVar2 = isspace((int)*local_50), iVar2 == 0)) {
      lVar3 = 4;
      do {
        bVar4 = local_48 << 2 == lVar3;
        if ((bVar4) || (*(int *)((long)plVar1 + lVar3) == 0x3d)) break;
        iVar2 = isspace(*(int *)((long)plVar1 + lVar3));
        lVar3 = lVar3 + 4;
      } while (iVar2 == 0);
    }
    if (!bVar4) goto LAB_001e3f0d;
    std::__cxx11::wstring::_M_assign((wstring *)delimiter_set);
    bVar4 = true;
    std::__cxx11::wstring::_M_assign((wstring *)&delimiter_set->end);
  }
  else {
LAB_001e3f0d:
    bVar4 = false;
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] * 4 + 4);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] * 4 + 4);
  }
LAB_001e3f4c:
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
  }
  return bVar4;
}

Assistant:

stream_type& render(basic_context<string_type>& ctx, stream_type& stream) {
        context_internal<string_type> context{ctx};
        render([&stream](const string_type& str) {
            stream << str;
        }, context);
        return stream;
    }